

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O0

Symbol __thiscall
google::protobuf::DescriptorBuilder::FindSymbol
          (DescriptorBuilder *this,string_view name,bool build_it)

{
  string_view package_name;
  string_view package_name_00;
  bool bVar1;
  reference ppFVar2;
  allocator<char> local_c1;
  string local_c0 [32];
  DescriptorBuilder *local_a0;
  size_t local_98;
  FileDescriptor *local_90;
  FileDescriptor *dep;
  iterator __end3;
  iterator __begin3;
  flat_hash_set<const_google::protobuf::FileDescriptor_*,_absl::lts_20250127::container_internal::HashEq<const_google::protobuf::FileDescriptor_*,_void>::Hash,_absl::lts_20250127::container_internal::HashEq<const_google::protobuf::FileDescriptor_*,_void>::Eq,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
  *__range3;
  FileDescriptor *local_50;
  FileDescriptor *file;
  char *local_40;
  Symbol local_38;
  Symbol result;
  bool build_it_local;
  DescriptorBuilder *this_local;
  string_view name_local;
  
  local_40 = name._M_str;
  file = (FileDescriptor *)name._M_len;
  result.ptr_._7_1_ = build_it;
  this_local = (DescriptorBuilder *)file;
  name_local._M_len = (size_t)local_40;
  local_38 = FindSymbolNotEnforcingDeps(this,name,build_it);
  bVar1 = Symbol::IsNull(&local_38);
  if (bVar1) {
    name_local._M_str = (char *)local_38.ptr_;
  }
  else if ((this->pool_->enforce_dependencies_ & 1U) == 0) {
    name_local._M_str = (char *)local_38.ptr_;
  }
  else {
    local_50 = Symbol::GetFile(&local_38);
    if ((local_50 == this->file_) ||
       (bVar1 = absl::lts_20250127::container_internal::
                raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<google::protobuf::FileDescriptor_const*>,absl::lts_20250127::container_internal::HashEq<google::protobuf::FileDescriptor_const*,void>::Hash,absl::lts_20250127::container_internal::HashEq<google::protobuf::FileDescriptor_const*,void>::Eq,std::allocator<google::protobuf::FileDescriptor_const*>>
                ::contains<google::protobuf::FileDescriptor_const*>
                          ((raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<google::protobuf::FileDescriptor_const*>,absl::lts_20250127::container_internal::HashEq<google::protobuf::FileDescriptor_const*,void>::Hash,absl::lts_20250127::container_internal::HashEq<google::protobuf::FileDescriptor_const*,void>::Eq,std::allocator<google::protobuf::FileDescriptor_const*>>
                            *)&this->dependencies_,&local_50), bVar1)) {
      name_local._M_str = (char *)local_38.ptr_;
    }
    else {
      bVar1 = Symbol::IsPackage(&local_38);
      if (bVar1) {
        package_name_00._M_str = (char *)name_local._M_len;
        package_name_00._M_len = (size_t)this_local;
        bVar1 = IsInPackage(this,this->file_,package_name_00);
        if (bVar1) {
          return (Symbol)local_38.ptr_;
        }
        join_0x00000010_0x00000000_ =
             absl::lts_20250127::container_internal::
             raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<const_google::protobuf::FileDescriptor_*>,_absl::lts_20250127::container_internal::HashEq<const_google::protobuf::FileDescriptor_*,_void>::Hash,_absl::lts_20250127::container_internal::HashEq<const_google::protobuf::FileDescriptor_*,_void>::Eq,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
             ::begin(&(this->dependencies_).
                      super_raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<const_google::protobuf::FileDescriptor_*>,_absl::lts_20250127::container_internal::HashEq<const_google::protobuf::FileDescriptor_*,_void>::Hash,_absl::lts_20250127::container_internal::HashEq<const_google::protobuf::FileDescriptor_*,_void>::Eq,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
                    );
        _dep = absl::lts_20250127::container_internal::
               raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<const_google::protobuf::FileDescriptor_*>,_absl::lts_20250127::container_internal::HashEq<const_google::protobuf::FileDescriptor_*,_void>::Hash,_absl::lts_20250127::container_internal::HashEq<const_google::protobuf::FileDescriptor_*,_void>::Eq,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
               ::end(&(this->dependencies_).
                      super_raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<const_google::protobuf::FileDescriptor_*>,_absl::lts_20250127::container_internal::HashEq<const_google::protobuf::FileDescriptor_*,_void>::Hash,_absl::lts_20250127::container_internal::HashEq<const_google::protobuf::FileDescriptor_*,_void>::Eq,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
                    );
        while (bVar1 = absl::lts_20250127::container_internal::operator!=
                                 ((iterator *)&__end3.field_1,(iterator *)&dep), bVar1) {
          ppFVar2 = absl::lts_20250127::container_internal::
                    raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<const_google::protobuf::FileDescriptor_*>,_absl::lts_20250127::container_internal::HashEq<const_google::protobuf::FileDescriptor_*,_void>::Hash,_absl::lts_20250127::container_internal::HashEq<const_google::protobuf::FileDescriptor_*,_void>::Eq,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
                    ::iterator::operator*((iterator *)&__end3.field_1);
          local_90 = *ppFVar2;
          if (local_90 != (FileDescriptor *)0x0) {
            local_a0 = this_local;
            local_98 = name_local._M_len;
            package_name._M_str = (char *)name_local._M_len;
            package_name._M_len = (size_t)this_local;
            bVar1 = IsInPackage(this,local_90,package_name);
            if (bVar1) {
              return (Symbol)local_38.ptr_;
            }
          }
          absl::lts_20250127::container_internal::
          raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<const_google::protobuf::FileDescriptor_*>,_absl::lts_20250127::container_internal::HashEq<const_google::protobuf::FileDescriptor_*,_void>::Hash,_absl::lts_20250127::container_internal::HashEq<const_google::protobuf::FileDescriptor_*,_void>::Eq,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
          ::iterator::operator++((iterator *)&__end3.field_1);
        }
      }
      this->possible_undeclared_dependency_ = local_50;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::basic_string_view<char,std::char_traits<char>>,void>
                (local_c0,(basic_string_view<char,_std::char_traits<char>_> *)&this_local,&local_c1)
      ;
      std::__cxx11::string::operator=
                ((string *)&this->possible_undeclared_dependency_name_,local_c0);
      std::__cxx11::string::~string(local_c0);
      std::allocator<char>::~allocator(&local_c1);
      Symbol::Symbol((Symbol *)&name_local._M_str);
    }
  }
  return (Symbol)(SymbolBase *)name_local._M_str;
}

Assistant:

Symbol DescriptorBuilder::FindSymbol(const absl::string_view name,
                                     bool build_it) {
  Symbol result = FindSymbolNotEnforcingDeps(name, build_it);

  if (result.IsNull()) return result;

  if (!pool_->enforce_dependencies_) {
    // Hack for CompilerUpgrader, and also used for lazily_build_dependencies_
    return result;
  }

  // Only find symbols which were defined in this file or one of its
  // dependencies.
  const FileDescriptor* file = result.GetFile();
  if (file == file_ || dependencies_.contains(file)) {
    return result;
  }

  if (result.IsPackage()) {
    // Arg, this is overcomplicated.  The symbol is a package name.  It could
    // be that the package was defined in multiple files.  result.GetFile()
    // returns the first file we saw that used this package.  We've determined
    // that that file is not a direct dependency of the file we are currently
    // building, but it could be that some other file which *is* a direct
    // dependency also defines the same package.  We can't really rule out this
    // symbol unless none of the dependencies define it.
    if (IsInPackage(file_, name)) return result;
    for (const auto* dep : dependencies_) {
      // Note:  A dependency may be nullptr if it was not found or had errors.
      if (dep != nullptr && IsInPackage(dep, name)) return result;
    }
  }

  possible_undeclared_dependency_ = file;
  possible_undeclared_dependency_name_ = std::string(name);
  return Symbol();
}